

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool pegmatite::parse(Input *i,Rule *g,Rule *ws,ErrorReporter *err,ParserDelegate *delegate,void *d)

{
  bool bVar1;
  Context con;
  undefined4 *local_160;
  undefined8 local_158;
  undefined4 local_150;
  undefined4 uStack_14c;
  Context local_140;
  InputRange local_50;
  
  Context::Context(&local_140,i,ws,delegate);
  Context::parse_rule(&local_140,local_140.whitespace_rule,
                      (offset_in_Context_to_subr)Context::_parse_term);
  bVar1 = Context::parse_rule(&local_140,g,(offset_in_Context_to_subr)Context::_parse_non_term);
  if (bVar1) {
    Context::parse_rule(&local_140,local_140.whitespace_rule,
                        (offset_in_Context_to_subr)Context::_parse_term);
    if ((local_140.position.it.buffer == local_140.finish.buffer) &&
       (local_140.position.it.idx == local_140.finish.idx)) {
      std::
      _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::clear(&local_140.cache._M_h);
      bVar1 = Context::do_parse_procs(&local_140,d);
      goto LAB_0012ac1a;
    }
    if (local_140.error_pos.it.idx < local_140.finish.idx) goto LAB_0012ac0b;
    InputRange::InputRange(&local_50,&local_140.error_pos,&local_140.error_pos);
    local_150 = 0x464f45;
    local_158 = 3;
    local_160 = &local_150;
    if (*(long *)(err + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)(err + 0x18))(err,&local_50,&local_160);
    if (local_160 != &local_150) {
      operator_delete(local_160,CONCAT44(uStack_14c,local_150) + 1);
    }
  }
  else {
LAB_0012ac0b:
    _syntax_Error(err,&local_140);
  }
  bVar1 = false;
LAB_0012ac1a:
  std::
  _Hashtable<pegmatite::Context::CacheKey,_std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>,_std::allocator<std::pair<const_pegmatite::Context::CacheKey,_std::pair<pegmatite::ParserPosition,_std::vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<pegmatite::Context::CacheKey>,_pegmatite::Context::CacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&local_140.cache._M_h);
  if (&local_140.cache._M_h._M_single_bucket != local_140.cache._M_h._M_buckets) {
    operator_delete(local_140.cache._M_h._M_buckets,local_140.cache._M_h._M_bucket_count << 3);
  }
  std::
  _Hashtable<const_pegmatite::Rule_*,_std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>,_std::allocator<std::pair<const_pegmatite::Rule_*const,_std::vector<pegmatite::Context::RuleState,_std::allocator<pegmatite::Context::RuleState>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_pegmatite::Rule_*>,_std::hash<const_pegmatite::Rule_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_140.rule_states._M_h);
  if (local_140.matches.
      super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.matches.
                    super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.matches.
                          super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.matches.
                          super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool parse(Input &i, const Rule &g, const Rule &ws, ErrorReporter &err,
           const ParserDelegate &delegate, void *d)
{
	//prepare context
	Context con(i, ws, delegate);

	//parse initial whitespace
	con.parse_term(con.whitespace_rule);

	//parse grammar
	if (!con.parse_non_term(g))
	{
		_syntax_Error(err, con);
		return false;
	}

	//parse whitespace at the end
	con.parse_term(con.whitespace_rule);

	//if end is not reached, there was an error
	if (!con.end())
	{
		if (con.error_pos.it < con.finish)
		{
			_syntax_Error(err, con);
		}
		else
		{
			_eof_Error(err, con);
		}
		return false;
	}

	con.clear_cache();

	//success; execute the parse procedures
	return con.do_parse_procs(d);
}